

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

void __thiscall Imf_2_5::SampleCountChannel::resize(SampleCountChannel *this)

{
  uint *puVar1;
  uint *puVar2;
  size_t *psVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  ImageChannel::resize(&this->super_ImageChannel);
  if (this->_numSamples != (uint *)0x0) {
    operator_delete__(this->_numSamples);
  }
  if (this->_sampleListSizes != (uint *)0x0) {
    operator_delete__(this->_sampleListSizes);
  }
  if (this->_sampleListPositions != (size_t *)0x0) {
    operator_delete__(this->_sampleListPositions);
  }
  this->_numSamples = (uint *)0x0;
  this->_sampleListSizes = (uint *)0x0;
  this->_sampleListPositions = (size_t *)0x0;
  uVar5 = (this->super_ImageChannel)._numPixels;
  uVar4 = -(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4;
  puVar2 = (uint *)operator_new__(uVar4);
  this->_numSamples = puVar2;
  puVar2 = (uint *)operator_new__(uVar4);
  this->_sampleListSizes = puVar2;
  psVar3 = (size_t *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3);
  this->_sampleListPositions = psVar3;
  resetBasePointer(this);
  puVar2 = this->_numSamples;
  puVar1 = this->_sampleListSizes;
  psVar3 = this->_sampleListPositions;
  for (uVar5 = 0; uVar5 < (this->super_ImageChannel)._numPixels; uVar5 = uVar5 + 1) {
    puVar2[uVar5] = 0;
    puVar1[uVar5] = 0;
    psVar3[uVar5] = 0;
  }
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  this->_sampleBufferSize = 0;
  return;
}

Assistant:

void
SampleCountChannel::resize ()
{
    ImageChannel::resize();

    delete [] _numSamples;
    delete [] _sampleListSizes;
    delete [] _sampleListPositions;

    _numSamples = 0;            // set to 0 to prevent double
    _sampleListSizes = 0;       // deletion in case of an exception
    _sampleListPositions = 0;

    _numSamples = new unsigned int [numPixels()];
    _sampleListSizes = new unsigned int [numPixels()];
    _sampleListPositions = new size_t [numPixels()];

    resetBasePointer();

    for (size_t i = 0; i < numPixels(); ++i)
    {
        _numSamples[i] = 0;
        _sampleListSizes[i] = 0;
        _sampleListPositions[i] = 0;
    }

    _totalNumSamples = 0;
    _totalSamplesOccupied = 0;

    _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);
}